

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O3

void __thiscall leveldb::anon_unknown_0::ShardedLRUCache::Prune(ShardedLRUCache *this)

{
  bool bVar1;
  int iVar2;
  LRUHandle *pLVar3;
  long lVar4;
  Mutex *__mutex;
  LRUCache *this_00;
  
  lVar4 = 0;
  do {
    __mutex = &this->shard_[lVar4].mutex_;
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar2 != 0) {
      std::__throw_system_error(iVar2);
    }
    this_00 = this->shard_ + lVar4;
    while (pLVar3 = (this_00->lru_).next, pLVar3 != &this_00->lru_) {
      if (pLVar3->refs != 1) {
        __assert_fail("e->refs == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/cache.cc"
                      ,0x147,"void leveldb::(anonymous namespace)::LRUCache::Prune()");
      }
      if (pLVar3->next == pLVar3) {
        __assert_fail("next != this",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/cache.cc"
                      ,0x3a,"Slice leveldb::(anonymous namespace)::LRUHandle::key() const");
      }
      pLVar3 = HandleTable::Remove(&this_00->table_,(Slice *)pLVar3->key_data,
                                   (uint32_t)pLVar3->key_length);
      bVar1 = LRUCache::FinishErase(this_00,pLVar3);
      if (!bVar1) {
        __assert_fail("erased",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/cache.cc"
                      ,0x14a,"void leveldb::(anonymous namespace)::LRUCache::Prune()");
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    lVar4 = lVar4 + 1;
    if (lVar4 == 0x10) {
      return;
    }
  } while( true );
}

Assistant:

void Prune() override {
    for (int s = 0; s < kNumShards; s++) {
      shard_[s].Prune();
    }
  }